

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

apx_error_t
apx_client_write_port_data(apx_client_t *self,apx_portInstance_t *port_instance,dtl_dv_t *dv)

{
  bool bVar1;
  apx_portType_t aVar2;
  uint32_t size;
  uint32_t offset_00;
  apx_program_t *program;
  apx_vm_t *paVar3;
  apx_nodeInstance_tag *self_00;
  apx_program_t *pack_program;
  uint32_t offset;
  uint32_t data_size;
  _Bool is_heap_allocated_buffer;
  uint8_t *write_buffer;
  uint8_t local_128 [4];
  apx_error_t result;
  uint8_t stack_buffer [256];
  dtl_dv_t *dv_local;
  apx_portInstance_t *port_instance_local;
  apx_client_t *self_local;
  
  if (((self == (apx_client_t *)0x0) || (port_instance == (apx_portInstance_t *)0x0)) ||
     (dv == (dtl_dv_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    bVar1 = false;
    stack_buffer._248_8_ = dv;
    size = apx_portInstance_data_size(port_instance);
    offset_00 = apx_portInstance_data_offset(port_instance);
    program = apx_portInstance_pack_program(port_instance);
    aVar2 = apx_portInstance_port_type(port_instance);
    if (aVar2 == '\x01') {
      if (program == (apx_program_t *)0x0) {
        self_local._4_4_ = 0x2e;
      }
      else {
        if (size < 0x101) {
          _data_size = local_128;
        }
        else {
          _data_size = (uint8_t *)malloc((ulong)size);
          if (_data_size == (uint8_t *)0x0) {
            return 2;
          }
          bVar1 = true;
        }
        if (_data_size == (uint8_t *)0x0) {
          __assert_fail("write_buffer != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/client.c"
                        ,0x1df,
                        "apx_error_t apx_client_write_port_data(apx_client_t *, apx_portInstance_t *, const dtl_dv_t *)"
                       );
        }
        pthread_mutex_lock((pthread_mutex_t *)&self->lock);
        if (self->vm == (apx_vm_tag *)0x0) {
          paVar3 = apx_vm_new();
          self->vm = paVar3;
          if (self->vm == (apx_vm_tag *)0x0) {
            pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
            if (bVar1) {
              free(_data_size);
            }
            return 2;
          }
        }
        if (self->vm == (apx_vm_tag *)0x0) {
          __assert_fail("self->vm != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/client.c"
                        ,0x1eb,
                        "apx_error_t apx_client_write_port_data(apx_client_t *, apx_portInstance_t *, const dtl_dv_t *)"
                       );
        }
        write_buffer._4_4_ = apx_vm_select_program(self->vm,program);
        if (write_buffer._4_4_ == 0) {
          write_buffer._4_4_ = apx_vm_set_write_buffer(self->vm,_data_size,size);
        }
        if (write_buffer._4_4_ == 0) {
          write_buffer._4_4_ = apx_vm_pack_value(self->vm,(dtl_dv_t *)stack_buffer._248_8_);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
        if (write_buffer._4_4_ == 0) {
          self_00 = apx_portInstance_parent(port_instance);
          write_buffer._4_4_ =
               apx_nodeInstance_write_provide_port_data(self_00,offset_00,_data_size,size);
        }
        if (bVar1) {
          free(_data_size);
        }
        self_local._4_4_ = write_buffer._4_4_;
      }
    }
    else {
      self_local._4_4_ = 0x3e;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_client_write_port_data(apx_client_t* self, apx_portInstance_t* port_instance, const dtl_dv_t* dv)
{
   if ((self != NULL) && (port_instance != NULL) && (dv != NULL))
   {
      uint8_t stack_buffer[MAX_STACK_BUFFER_SIZE];
      apx_error_t result;
      uint8_t* write_buffer;
      bool is_heap_allocated_buffer = false;
      uint32_t const data_size = apx_portInstance_data_size(port_instance);
      uint32_t const offset = apx_portInstance_data_offset(port_instance);
      apx_program_t const* pack_program = apx_portInstance_pack_program(port_instance);

      if (apx_portInstance_port_type(port_instance) != APX_PROVIDE_PORT)
      {
         return APX_INVALID_PORT_HANDLE_ERROR;
      }
      if (pack_program == NULL)
      {
         return APX_INVALID_PROGRAM_ERROR;
      }
      if (data_size > MAX_STACK_BUFFER_SIZE)
      {
         write_buffer = (uint8_t*)malloc(data_size);
         if (write_buffer == NULL)
         {
            return APX_MEM_ERROR;
         }
         is_heap_allocated_buffer = true;
      }
      else
      {
         write_buffer = &stack_buffer[0];
      }
      assert(write_buffer != NULL);
      MUTEX_LOCK(self->lock);
      if (self->vm == NULL)
      {
         self->vm = apx_vm_new();
         if (self->vm == NULL)
         {
            MUTEX_UNLOCK(self->lock);
            if (is_heap_allocated_buffer) free(write_buffer);
            return APX_MEM_ERROR;
         }
      }
      assert(self->vm != NULL);
      result = apx_vm_select_program(self->vm, pack_program);
      if (result == APX_NO_ERROR)
      {
         result = apx_vm_set_write_buffer(self->vm, write_buffer, data_size);
      }
      if (result == APX_NO_ERROR)
      {
         result = apx_vm_pack_value(self->vm, dv);
      }
      MUTEX_UNLOCK(self->lock);
      if (result == APX_NO_ERROR)
      {
         result = apx_nodeInstance_write_provide_port_data(apx_portInstance_parent(port_instance), offset, write_buffer, data_size);
      }
      if (is_heap_allocated_buffer) free(write_buffer);
      return result;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}